

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_array.h
# Opt level: O0

void __thiscall
agg::pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::capacity
          (pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y> *this,uint cap,
          uint extra_tail)

{
  sorted_y *local_28;
  uint extra_tail_local;
  uint cap_local;
  pod_vector<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y> *this_local;
  
  this->m_size = 0;
  if (this->m_capacity < cap) {
    pod_allocator<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::deallocate
              (this->m_array,this->m_capacity);
    this->m_capacity = cap + extra_tail;
    if (this->m_capacity == 0) {
      local_28 = (sorted_y *)0x0;
    }
    else {
      local_28 = pod_allocator<agg::rasterizer_cells_aa<agg::cell_aa>::sorted_y>::allocate
                           (this->m_capacity);
    }
    this->m_array = local_28;
  }
  return;
}

Assistant:

void pod_vector<T>::capacity(unsigned cap, unsigned extra_tail)
    {
        m_size = 0;
        if(cap > m_capacity)
        {
            pod_allocator<T>::deallocate(m_array, m_capacity);
            m_capacity = cap + extra_tail;
            m_array = m_capacity ? pod_allocator<T>::allocate(m_capacity) : 0;
        }
    }